

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileLexer.cxx
# Opt level: O2

void cmGccDepfile_yypush_buffer_state(YY_BUFFER_STATE_conflict new_buffer,yyscan_t yyscanner)

{
  long lVar1;
  long lVar2;
  yyguts_t_conflict1 *yyg;
  
  if (new_buffer != (YY_BUFFER_STATE_conflict)0x0) {
    cmGccDepfile_yyensure_buffer_stack(yyscanner);
    lVar1 = *(long *)((long)yyscanner + 0x18);
    lVar2 = *(long *)((long)yyscanner + 0x28);
    if (*(long *)(lVar2 + lVar1 * 8) != 0) {
      **(undefined1 **)((long)yyscanner + 0x48) = *(undefined1 *)((long)yyscanner + 0x30);
      lVar1 = *(long *)((long)yyscanner + 0x18);
      lVar2 = *(long *)((long)yyscanner + 0x28);
      *(undefined8 *)(*(long *)(lVar2 + lVar1 * 8) + 0x10) = *(undefined8 *)((long)yyscanner + 0x48)
      ;
      *(undefined8 *)(*(long *)(lVar2 + lVar1 * 8) + 0x20) = *(undefined8 *)((long)yyscanner + 0x38)
      ;
      lVar1 = lVar1 + 1;
      *(long *)((long)yyscanner + 0x18) = lVar1;
    }
    *(YY_BUFFER_STATE_conflict *)(lVar2 + lVar1 * 8) = new_buffer;
    cmGccDepfile_yy_load_buffer_state(yyscanner);
    *(undefined4 *)((long)yyscanner + 0x58) = 1;
  }
  return;
}

Assistant:

void yypush_buffer_state (YY_BUFFER_STATE new_buffer , yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;
	if (new_buffer == NULL)
		return;

	yyensure_buffer_stack(yyscanner);

	/* This block is copied from yy_switch_to_buffer. */
	if ( YY_CURRENT_BUFFER )
		{
		/* Flush out information for old buffer. */
		*yyg->yy_c_buf_p = yyg->yy_hold_char;
		YY_CURRENT_BUFFER_LVALUE->yy_buf_pos = yyg->yy_c_buf_p;
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = yyg->yy_n_chars;
		}

	/* Only push if top exists. Otherwise, replace top. */
	if (YY_CURRENT_BUFFER)
		yyg->yy_buffer_stack_top++;
	YY_CURRENT_BUFFER_LVALUE = new_buffer;

	/* copied from yy_switch_to_buffer. */
	yy_load_buffer_state( yyscanner );
	yyg->yy_did_buffer_switch_on_eof = 1;
}